

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlcachedresult.cpp
# Opt level: O2

bool __thiscall QSqlCachedResult::fetchFirst(QSqlCachedResult *this)

{
  QSqlResultPrivate *pQVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  
  pQVar1 = (this->super_QSqlResult).d_ptr;
  bVar2 = pQVar1->forwardOnly;
  if ((bool)bVar2 == true) {
    iVar4 = QSqlResult::at(&this->super_QSqlResult);
    if (iVar4 != -1) {
      return false;
    }
    bVar2 = pQVar1->forwardOnly;
  }
  if (((bVar2 & 1) == 0) &&
     (*(int *)((long)&pQVar1[1].sqldriver.wp.value + 4) <= *(int *)&pQVar1[1].sqldriver.wp.value)) {
    (*(this->super_QSqlResult)._vptr_QSqlResult[3])(this,0);
    return true;
  }
  bVar3 = cacheNext(this);
  return bVar3;
}

Assistant:

bool QSqlCachedResult::fetchFirst()
{
    Q_D(QSqlCachedResult);
    if (d->forwardOnly && at() != QSql::BeforeFirstRow) {
        return false;
    }
    if (d->canSeek(0)) {
        setAt(0);
        return true;
    }
    return cacheNext();
}